

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.cpp
# Opt level: O2

void Shell::Shuffling::shuffle(Clause *clause)

{
  uint len;
  
  len = *(uint *)&clause->field_0x3c & 0xfffff;
  shuffleArray<Kernel::Literal*>(clause->_literals,len);
  shuffleArray<Kernel::Literal*>
            (clause->_literals + len,(*(uint *)&clause->field_0x38 & 0xfffff) - len);
  Kernel::Clause::notifyLiteralReorder(clause);
  return;
}

Assistant:

void Shuffling::shuffle(Clause* clause)
{
  unsigned s = clause->numSelected();

  // don't shuffle between selected and non-selected literals
  shuffleArray(clause->literals(),s);
  shuffleArray(clause->literals()+s,clause->length()-s);

  // literals must be shared in typical clauses (I think), so let's not even try shuffling them

  clause->notifyLiteralReorder();
}